

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScriptContext.cpp
# Opt level: O3

void __thiscall
Js::ScriptContext::LogCacheUsage
          (ScriptContext *this,PolymorphicInlineCache *cache,bool isGetter,PropertyId propertyId,
          bool hit,bool collision)

{
  code *pcVar1;
  bool bVar2;
  Recycler *alloc;
  BaseDictionary<const_Js::PolymorphicInlineCache_*,_InlineCacheData_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  *this_00;
  undefined4 *puVar3;
  undefined7 in_register_00000011;
  CacheDataMap *this_01;
  undefined3 in_register_00000081;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined **local_68;
  InlineCacheData *data;
  size_t local_58;
  char *local_50;
  DWORD local_48;
  PolymorphicInlineCache *local_40;
  PolymorphicInlineCache *cache_local;
  
  uVar4 = CONCAT31(in_register_00000081,hit);
  uVar5 = (undefined4)CONCAT71(in_register_00000011,isGetter);
  this_01 = this->cacheDataMap;
  local_40 = cache;
  if (this_01 == (CacheDataMap *)0x0) {
    local_68 = &JsUtil::
                BaseDictionary<Js::PolymorphicInlineCache_const*,InlineCacheData*,Memory::Recycler,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
                ::typeinfo;
    data = (InlineCacheData *)0x0;
    local_58 = 0xffffffffffffffff;
    local_50 = 
    "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/ScriptContext.cpp"
    ;
    local_48 = 0x1983;
    alloc = Memory::Recycler::TrackAllocInfo
                      (this->recycler,(TrackAllocData *)&stack0xffffffffffffff98);
    this_00 = (BaseDictionary<const_Js::PolymorphicInlineCache_*,_InlineCacheData_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
               *)new<Memory::Recycler>(0x38,alloc,0x387914);
    cache_local._4_4_ = uVar5;
    JsUtil::
    BaseDictionary<const_Js::PolymorphicInlineCache_*,_InlineCacheData_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
    ::BaseDictionary(this_00,this->recycler,0);
    uVar5 = cache_local._4_4_;
    this->cacheDataMap = this_00;
    BindReference(this,this_00);
    this_01 = this->cacheDataMap;
  }
  local_68 = (undefined **)0x0;
  bVar2 = JsUtil::
          BaseDictionary<Js::PolymorphicInlineCache_const*,InlineCacheData*,Memory::Recycler,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
          ::TryGetValue<Js::PolymorphicInlineCache*>
                    ((BaseDictionary<Js::PolymorphicInlineCache_const*,InlineCacheData*,Memory::Recycler,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
                      *)this_01,&local_40,(InlineCacheData **)&stack0xffffffffffffff98);
  if (bVar2) {
    if (((InlineCacheData *)local_68)->isGetCache != SUB41(uVar5,0)) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar3 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/ScriptContext.cpp"
                                  ,0x1990,"(data->isGetCache == isGetter)",
                                  "data->isGetCache == isGetter");
      if (!bVar2) goto LAB_0078f935;
      *puVar3 = 0;
    }
  }
  else {
    cache_local._4_4_ = uVar4;
    local_68 = (undefined **)new<Memory::ArenaAllocator>(0x14,&this->generalAllocator,0x364470);
    ((InlineCacheData *)local_68)->hits = 0;
    ((InlineCacheData *)local_68)->misses = 0;
    *(undefined8 *)((long)&((InlineCacheData *)local_68)->misses + 1) = 0;
    ((InlineCacheData *)local_68)->propertyId = 0x10;
    JsUtil::
    BaseDictionary<Js::PolymorphicInlineCache_const*,InlineCacheData*,Memory::Recycler,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
    ::
    Insert<(JsUtil::BaseDictionary<Js::PolymorphicInlineCache_const*,InlineCacheData*,Memory::Recycler,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>::InsertOperations)2>
              ((BaseDictionary<Js::PolymorphicInlineCache_const*,InlineCacheData*,Memory::Recycler,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
                *)this->cacheDataMap,&local_40,(InlineCacheData **)&stack0xffffffffffffff98);
    ((InlineCacheData *)local_68)->isGetCache = SUB41(uVar5,0);
    ((InlineCacheData *)local_68)->propertyId = propertyId;
    uVar4 = cache_local._4_4_;
  }
  if (((InlineCacheData *)local_68)->propertyId != propertyId) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/ScriptContext.cpp"
                                ,0x1991,"(data->propertyId == propertyId)",
                                "data->propertyId == propertyId");
    if (!bVar2) {
LAB_0078f935:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  (&((InlineCacheData *)local_68)->hits)[(byte)((byte)uVar4 ^ 1)] =
       (&((InlineCacheData *)local_68)->hits)[(byte)((byte)uVar4 ^ 1)] + 1;
  if (collision) {
    ((InlineCacheData *)local_68)->collisions = ((InlineCacheData *)local_68)->collisions + 1;
  }
  return;
}

Assistant:

void ScriptContext::LogCacheUsage(Js::PolymorphicInlineCache *cache, bool isGetter, Js::PropertyId propertyId, bool hit, bool collision)
    {
        if (cacheDataMap == NULL)
        {
            cacheDataMap = RecyclerNew(this->recycler, CacheDataMap, this->recycler);
            BindReference(cacheDataMap);
        }

        InlineCacheData *data = NULL;
        if (!cacheDataMap->TryGetValue(cache, &data))
        {
            data = Anew(GeneralAllocator(), InlineCacheData);
            cacheDataMap->Item(cache, data);
            data->isGetCache = isGetter;
            data->propertyId = propertyId;
        }

        Assert(data->isGetCache == isGetter);
        Assert(data->propertyId == propertyId);

        if (hit)
        {
            data->hits++;
        }
        else
        {
            data->misses++;
        }
        if (collision)
        {
            data->collisions++;
        }
    }